

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O3

Type GradientBaseFP::fetchSingle(QGradientData *gradient,int v)

{
  ulong uVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  undefined1 auVar4 [12];
  undefined1 auVar5 [14];
  uint uVar6;
  uint uVar7;
  Type TVar8;
  
  uVar6 = v + 0x80 >> 8;
  uVar7 = uVar6;
  if (0x3ff < uVar6) {
    if (gradient->spread == ReflectSpread) {
      uVar7 = uVar6 & 0x7ff;
      if (0x3ff < uVar7) {
        uVar7 = uVar7 ^ 0x7ff;
      }
    }
    else if (gradient->spread == RepeatSpread) {
      uVar7 = uVar6 & 0x3ff;
    }
    else {
      uVar7 = 0x3ff;
      if ((int)uVar6 < 0) {
        uVar7 = 0;
      }
    }
  }
  uVar1 = gradient->colorTable64[uVar7].rgba;
  auVar2._8_4_ = 0;
  auVar2._0_8_ = uVar1;
  auVar2._12_2_ = (short)(uVar1 >> 0x30);
  auVar3._8_2_ = (short)(uVar1 >> 0x20);
  auVar3._0_8_ = uVar1;
  auVar3._10_4_ = auVar2._10_4_;
  auVar5._6_8_ = 0;
  auVar5._0_6_ = auVar3._8_6_;
  TVar8.r = (float)(ushort)uVar1 * 1.5259022e-05;
  TVar8.g = (float)(int)CONCAT82(SUB148(auVar5 << 0x40,6),(short)(uVar1 >> 0x10)) * 1.5259022e-05;
  auVar4._4_4_ = (float)auVar3._8_4_ * 1.5259022e-05;
  auVar4._0_4_ = TVar8.g;
  auVar4._8_4_ = (float)(auVar2._10_4_ >> 0x10) * 1.5259022e-05;
  TVar8.b = (float)(int)auVar4._4_8_;
  TVar8.a = (float)(int)((ulong)auVar4._4_8_ >> 0x20);
  return TVar8;
}

Assistant:

static Type fetchSingle(const QGradientData& gradient, int v)
    {
        return qt_gradient_pixelFP_fixed(&gradient, v);
    }